

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<ExprPrinter>>::ObjHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
           *this)

{
  bool bVar1;
  uint lb;
  int iVar2;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *in_RDI;
  int num_terms;
  int index;
  ObjHandler lh;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ObjHandler *in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::ItemType)1>
  in_stack_fffffffffffffff0;
  
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::
  ObjHandler::ObjHandler
            ((ObjHandler *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::
  ObjHandler::num_items((ObjHandler *)&stack0xfffffffffffffff0);
  lb = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
       ::ReadUInt(in_stack_fffffffffffffff0.reader_,in_stack_ffffffffffffffec);
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
          ::ReadUInt(in_stack_fffffffffffffff0.reader_,lb,in_stack_ffffffffffffffe8);
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)in_stack_fffffffffffffff0.reader_);
  bVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
          ::ObjHandler::SkipExpr
                    ((ObjHandler *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  if (bVar1) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::
    ReadLinearExpr<mp::internal::NullLinearExprHandler>(in_RDI,iVar2);
  }
  else {
    ObjHandler::OnLinearExpr_abi_cxx11_
              (in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::LinearExprHandler>
              (in_RDI,iVar2);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}